

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool google::ParseCharClass(State *state,char *char_class)

{
  char cVar1;
  
  do {
    cVar1 = *char_class;
    if (cVar1 == '\0') goto LAB_0011f64d;
    char_class = char_class + 1;
  } while (*state->mangled_cur != cVar1);
  state->mangled_cur = state->mangled_cur + 1;
LAB_0011f64d:
  return cVar1 != '\0';
}

Assistant:

static bool ParseCharClass(State *state, const char *char_class) {
  const char *p = char_class;
  for (; *p != '\0'; ++p) {
    if (state->mangled_cur[0] == *p) {
      ++state->mangled_cur;
      return true;
    }
  }
  return false;
}